

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plain_bonsai_nlm.hpp
# Opt level: O3

void __thiscall
poplar::plain_bonsai_nlm<int>::
expand<poplar::plain_bonsai_trie<90u,poplar::hash::vigna_hasher>::node_map>
          (plain_bonsai_nlm<int> *this,node_map *pos_map)

{
  pointer puVar1;
  __uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> _Var2;
  uchar *puVar3;
  uint64_t uVar4;
  uint64_t i;
  vector<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
  new_ptrs;
  undefined1 local_58 [16];
  pointer local_48;
  vector<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
  local_38;
  
  std::
  vector<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
  ::vector((vector<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
            *)local_58,
           (long)(this->ptrs_).
                 super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->ptrs_).
                 super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 2,(allocator_type *)&local_38);
  if ((pos_map->map_).size_ != 0) {
    i = 0;
    do {
      uVar4 = plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>::node_map::operator[](pos_map,i);
      if (uVar4 != 0xffffffffffffffff) {
        puVar1 = (this->ptrs_).
                 super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar4 = plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>::node_map::operator[](pos_map,i);
        _Var2._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
        super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
             puVar1[i]._M_t.
             super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t;
        puVar1[i]._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> =
             (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)0x0;
        puVar3 = (((pointer)(local_58._0_8_ + uVar4 * 8))->_M_t).
                 super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                 super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
        (((pointer)(local_58._0_8_ + uVar4 * 8))->_M_t).
        super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
        super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
        super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
             (uchar *)_Var2._M_t.
                      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                      .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
        if (puVar3 != (uchar *)0x0) {
          operator_delete__(puVar3);
        }
      }
      i = i + 1;
    } while (i < (pos_map->map_).size_);
  }
  local_38.
  super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->ptrs_).
       super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->ptrs_).
  super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_48;
  local_38.
  super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (this->ptrs_).
       super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_38.
  super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (this->ptrs_).
       super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->ptrs_).
  super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_58._0_8_;
  (this->ptrs_).
  super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_58._8_8_;
  local_58 = ZEXT816(0) << 0x20;
  local_48 = (pointer)0x0;
  std::
  vector<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
  ::~vector(&local_38);
  std::
  vector<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
  ::~vector((vector<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
             *)local_58);
  return;
}

Assistant:

void expand(const T& pos_map) {
        std::vector<std::unique_ptr<uint8_t[]>> new_ptrs(ptrs_.size() * 2);
        for (uint64_t i = 0; i < pos_map.size(); ++i) {
            if (pos_map[i] != UINT64_MAX) {
                new_ptrs[pos_map[i]] = std::move(ptrs_[i]);
            }
        }
        ptrs_ = std::move(new_ptrs);
    }